

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::BlockedReceive::close(BlockedReceive *this,int __fd)

{
  _func_int **pp_Var1;
  bool bVar2;
  uint16_t in_DX;
  StringPtr *params;
  undefined4 in_register_00000034;
  WebSocket *obj;
  Close local_90;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_70;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  uint16_t code_local;
  BlockedReceive *this_local;
  StringPtr reason_local;
  
  obj = (WebSocket *)CONCAT44(in_register_00000034,__fd);
  f.exception._6_2_ = in_DX;
  reason_local.content.size_ = (size_t)this;
  f.exception._4_1_ = Canceler::isEmpty((Canceler *)(obj + 4));
  f.exception._5_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 5))
  ;
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1072,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
               (DebugExpression<bool> *)((long)&f.exception + 5),(char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  pp_Var1 = obj[1]._vptr_WebSocket;
  local_90.code = f.exception._6_2_;
  str<kj::StringPtr&>(&local_90.reason,(kj *)&this_local,params);
  OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>::OneOf<kj::WebSocket::Close,int>
            ((OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close> *)&local_70,&local_90)
  ;
  (**(code **)(*pp_Var1 + 0x10))(pp_Var1,&local_70);
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf(&local_70);
  WebSocket::Close::~Close(&local_90);
  endState((WebSocketPipeImpl *)obj[2]._vptr_WebSocket,obj);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");
      fulfiller.fulfill(Message(Close { code, kj::str(reason) }));
      pipe.endState(*this);
      return kj::READY_NOW;
    }